

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O3

void __thiscall
idx2::WriteChunkExponents
          (idx2 *this,idx2_file *Idx2,encode_data *E,sub_channel *Sc,i8 Level,i8 Subband)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  void *__src;
  ulong *puVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  char Level_00;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  unsigned_long *puVar11;
  int iVar12;
  bucket_status *pbVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  i64 NewCapacity;
  int iVar17;
  ulong uVar18;
  long lVar19;
  undefined8 in_XMM0_Qa;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM4_Qb;
  iterator CemIt;
  file_id FileId;
  chunk_exp_info ChunkExpInfo;
  iterator local_100;
  undefined1 local_e0 [24];
  chunk_exp_info local_c8;
  
  Level_00 = (char)Sc;
  pbVar13 = (E->Channels).Stats;
  uVar4 = (E->Channels).Size;
  *(undefined8 *)pbVar13 = uVar4;
  uVar8 = (uint)(E->Channels).LogCapacity;
  if (0 < (int)uVar8 >> 3) {
    (E->Channels).Size = ((ulong)uVar4 >> 1) >> (((byte)uVar8 & 0xf8) - 1 & 0x3f);
  }
  pbVar13 = pbVar13 + ((int)uVar8 >> 3);
  (E->Channels).Stats = pbVar13;
  *(uint *)&(E->Channels).LogCapacity = uVar8 & 7;
  local_c8.ExpSizes.Stream.Data = (byte *)(E->BrickPool).Alloc;
  auVar20._0_8_ =
       (double)(long)(pbVar13 + ((ulong)((uVar8 & 7) != 0) - (long)local_c8.ExpSizes.Stream.Data));
  auVar20._8_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _ZN4idx2L25UncompressedExpChunksStatE_0;
  auVar7 = vminsd_avx(auVar20,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = _ZN4idx2L25UncompressedExpChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar20,auVar2);
  _ZN4idx2L25UncompressedExpChunksStatE_2 = auVar20._0_8_ + _ZN4idx2L25UncompressedExpChunksStatE_2;
  _ZN4idx2L25UncompressedExpChunksStatE_0 = auVar7._0_8_;
  _ZN4idx2L25UncompressedExpChunksStatE_3 = _ZN4idx2L25UncompressedExpChunksStatE_3 + 1;
  _ZN4idx2L25UncompressedExpChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L25UncompressedExpChunksStatE_4 =
       auVar20._0_8_ * auVar20._0_8_ + _ZN4idx2L25UncompressedExpChunksStatE_4;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data =
       (byte *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  *(undefined4 *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc = 0;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Bytes = 0;
  iVar12 = (int)(E->Channels).LogCapacity;
  iVar17 = iVar12 + 7;
  iVar12 = iVar12 + 0xe;
  if (-1 < iVar17) {
    iVar12 = iVar17;
  }
  local_c8.ExpSizes.Stream.Alloc = (allocator *)(E->Channels).Vals;
  local_c8.ExpSizes.Stream.Bytes =
       (i64)((E->Channels).Stats + ((long)(iVar12 >> 3) - (long)local_c8.ExpSizes.Stream.Data));
  CompressBufZstd((buffer *)&local_c8,(bitstream *)&(Idx2->DecodeSubbandSpacings).Arr[9].Size);
  iVar12 = *(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc;
  iVar17 = iVar12 + 7;
  iVar12 = iVar12 + 0xe;
  if (-1 < iVar17) {
    iVar12 = iVar17;
  }
  auVar21._0_8_ =
       (double)(long)((Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data +
                     ((long)(iVar12 >> 3) - (Idx2->DecodeSubbandSpacings).Arr[9].Size));
  auVar21._8_8_ = in_XMM4_Qb;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_0;
  auVar1 = vminsd_avx(auVar21,auVar7);
  _ZN4idx2L23CompressedExpChunksStatE_0 = auVar1._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = _ZN4idx2L23CompressedExpChunksStatE_1;
  auVar1 = vmaxsd_avx(auVar21,auVar3);
  _ZN4idx2L23CompressedExpChunksStatE_1 = auVar1._0_8_;
  _ZN4idx2L23CompressedExpChunksStatE_2 = auVar21._0_8_ + _ZN4idx2L23CompressedExpChunksStatE_2;
  _ZN4idx2L23CompressedExpChunksStatE_3 = _ZN4idx2L23CompressedExpChunksStatE_3 + 1;
  _ZN4idx2L23CompressedExpChunksStatE_4 =
       auVar21._0_8_ * auVar21._0_8_ + _ZN4idx2L23CompressedExpChunksStatE_4;
  (E->Channels).Stats = (bucket_status *)(E->BrickPool).Alloc;
  *(undefined4 *)&(E->Channels).LogCapacity = 0;
  (E->Channels).Size = 0;
  puVar11 = (unsigned_long *)(ulong)(uint)(int)Level_00;
  ConstructFilePath((file_id *)local_e0,(idx2_file *)this,(u64)(E->SubChannels).Keys,Level_00,Level,
                    0);
  Lookup<unsigned_long,idx2::chunk_exp_info>
            (&local_100,(idx2 *)&(Idx2->DecodeSubbandSpacings).Arr[6].Size,
             (hash_table<unsigned_long,_idx2::chunk_exp_info> *)(local_e0 + 0x10),puVar11);
  if ((local_100.Ht)->Stats[local_100.Idx] != Occupied) {
    chunk_exp_info::chunk_exp_info(&local_c8);
    if (Mallocator()::Instance == '\0') {
      WriteChunkExponents();
    }
    (*(code *)*Mallocator()::Instance)(&Mallocator()::Instance,&local_c8,0x88);
    local_c8.ExpSizes.BitPtr = local_c8.ExpSizes.Stream.Data;
    local_c8.ExpSizes.BitPos = 0;
    local_c8.ExpSizes.BitBuf = 0;
    Insert<unsigned_long,idx2::chunk_exp_info>
              (&local_100,(unsigned_long *)(local_e0 + 0x10),&local_c8);
  }
  lVar15 = ((local_100.Val)->ExpSizes).Stream.Bytes;
  uVar8 = ((local_100.Val)->ExpSizes).BitPos;
  iVar17 = uVar8 + 0xe;
  if (-1 < (int)(uVar8 + 7)) {
    iVar17 = uVar8 + 7;
  }
  pbVar14 = ((local_100.Val)->ExpSizes).BitPtr +
            ((long)(iVar17 >> 3) - (long)((local_100.Val)->ExpSizes).Stream.Data) + 0xc;
  lVar16 = lVar15;
  if (lVar15 <= (long)pbVar14) {
    do {
      lVar19 = (lVar16 * 3) / 2;
      lVar16 = lVar19 + 8;
    } while (lVar16 <= (long)pbVar14);
    if (lVar15 < lVar16) {
      if (Mallocator()::Instance == '\0') {
        WriteChunkExponents();
      }
      local_c8.ExpSizes.Stream.Data = (byte *)0x0;
      local_c8.ExpSizes.Stream.Bytes = 0;
      local_c8.ExpSizes.Stream.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf((buffer *)&local_c8,lVar19 + 0x10,((local_100.Val)->ExpSizes).Stream.Alloc);
      iVar12 = ((local_100.Val)->ExpSizes).BitPos;
      iVar17 = iVar12 + 7;
      iVar12 = iVar12 + 0xe;
      if (-1 < iVar17) {
        iVar12 = iVar17;
      }
      MemCopy((buffer *)local_100.Val,(buffer *)&local_c8,
              (u64)(((local_100.Val)->ExpSizes).BitPtr +
                   ((long)(iVar12 >> 3) - (long)((local_100.Val)->ExpSizes).Stream.Data)));
      ((local_100.Val)->ExpSizes).BitPtr =
           (byte *)(((long)((local_100.Val)->ExpSizes).BitPtr -
                    (long)((local_100.Val)->ExpSizes).Stream.Data) +
                   (long)local_c8.ExpSizes.Stream.Data);
      DeallocBuf((buffer *)local_100.Val);
      ((local_100.Val)->ExpSizes).Stream.Alloc = local_c8.ExpSizes.Stream.Alloc;
      ((local_100.Val)->ExpSizes).Stream.Data = local_c8.ExpSizes.Stream.Data;
      ((local_100.Val)->ExpSizes).Stream.Bytes = local_c8.ExpSizes.Stream.Bytes;
      uVar8 = ((local_100.Val)->ExpSizes).BitPos;
    }
  }
  __src = (void *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  iVar12 = *(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc;
  iVar17 = iVar12 + 7;
  iVar12 = iVar12 + 0xe;
  if (-1 < iVar17) {
    iVar12 = iVar17;
  }
  uVar18 = ((local_100.Val)->ExpSizes).BitBuf;
  pbVar14 = (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data + ((long)(iVar12 >> 3) - (long)__src);
  do {
    if (0x38 < (int)uVar8) {
      puVar5 = (ulong *)((local_100.Val)->ExpSizes).BitPtr;
      *puVar5 = uVar18;
      uVar18 = (uVar18 >> 1) >> (((byte)uVar8 & 0xf8) - 1 & 0x3f);
      ((local_100.Val)->ExpSizes).BitBuf = uVar18;
      ((local_100.Val)->ExpSizes).BitPtr = (byte *)((ulong)(uVar8 >> 3) + (long)puVar5);
      uVar8 = uVar8 & 7;
    }
    uVar18 = (ulong)((uint)pbVar14 & 0x7f & (uint)bitstream::Masks.Arr[7]) << ((byte)uVar8 & 0x3f) |
             uVar18;
    ((local_100.Val)->ExpSizes).BitBuf = uVar18;
    uVar10 = uVar8 + 7;
    if (0x37 < (int)uVar8) {
      puVar5 = (ulong *)((local_100.Val)->ExpSizes).BitPtr;
      *puVar5 = uVar18;
      uVar18 = (((local_100.Val)->ExpSizes).BitBuf >> 1) >> (((byte)uVar10 & 0xf8) - 1 & 0x3f);
      ((local_100.Val)->ExpSizes).BitPtr = (byte *)((ulong)(uVar10 >> 3) + (long)puVar5);
      uVar10 = 7;
    }
    uVar18 = (ulong)((byte *)0x7f < pbVar14 & (uint)bitstream::Masks.Arr[1]) <<
             ((byte)uVar10 & 0x3f) | uVar18;
    uVar8 = uVar10 + 1;
    ((local_100.Val)->ExpSizes).BitBuf = uVar18;
    bVar6 = (byte *)0x7f < pbVar14;
    pbVar14 = (byte *)((ulong)pbVar14 >> 7);
  } while (bVar6);
  ((local_100.Val)->ExpSizes).BitPos = uVar8;
  iVar12 = *(int *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc;
  iVar17 = iVar12 + 7;
  iVar12 = iVar12 + 0xe;
  if (-1 < iVar17) {
    iVar12 = iVar17;
  }
  pbVar14 = (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data + ((long)(iVar12 >> 3) - (long)__src);
  lVar15 = ((local_100.Val)->FileExpBuffer).Size;
  for (NewCapacity = ((local_100.Val)->FileExpBuffer).Capacity;
      NewCapacity <= (long)(pbVar14 + lVar15); NewCapacity = (NewCapacity * 3) / 2 + 8) {
  }
  GrowCapacity<unsigned_char>(&(local_100.Val)->FileExpBuffer,NewCapacity);
  if (((local_100.Val)->FileExpBuffer).Buffer.Bytes <= lVar15) {
    __assert_fail("Idx < Bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.h"
                  ,0x165,"byte &idx2::buffer::operator[](i64) const");
  }
  memcpy(((local_100.Val)->FileExpBuffer).Buffer.Data + lVar15,__src,(size_t)pbVar14);
  ((local_100.Val)->FileExpBuffer).Size = (i64)(pbVar14 + lVar15);
  if ('\x0f' < Level_00) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  puVar11 = (E->SubChannels).Keys;
  iVar17 = *(int *)(this + (long)Level_00 * 4 + 0xa00);
  uVar18 = (ulong)iVar17;
  lVar15 = ((local_100.Val)->Addrs).Size;
  if (((local_100.Val)->Addrs).Capacity <= lVar15) {
    GrowCapacity<unsigned_long>(&(local_100.Val)->Addrs,0);
    lVar15 = ((local_100.Val)->Addrs).Size;
  }
  lVar16 = 0x3f;
  if (uVar18 != 0) {
    for (; uVar18 >> lVar16 == 0; lVar16 = lVar16 + -1) {
    }
  }
  bVar9 = -(iVar17 == 0) | (byte)lVar16;
  ((local_100.Val)->Addrs).Size = lVar15 + 1;
  *(ulong *)(((local_100.Val)->Addrs).Buffer.Data + lVar15 * 8) =
       (long)((int)Level << 0xc) + ((ulong)((uint)Sc & 0xff) << 0x3c) +
       ((ulong)puVar11 >> ((1L << (bVar9 & 0x3f) != uVar18) + bVar9 & 0x3f)) * 0x40000;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Data =
       (byte *)(Idx2->DecodeSubbandSpacings).Arr[9].Size;
  *(undefined4 *)&(Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Alloc = 0;
  (Idx2->DecodeSubbandSpacings).Arr[10].Buffer.Bytes = 0;
  return;
}

Assistant:

void
WriteChunkExponents(const idx2_file& Idx2, encode_data* E, sub_channel* Sc, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_write){

    /* brick exponents */
    Flush(&Sc->BrickExpStream);
    UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
    Rewind(&E->ChunkExpStream);
    CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
    CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));
    Rewind(&Sc->BrickExpStream);
    u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
    buffer Buf = ToBuffer(E->ChunkExpStream);
    if (!Idx2.external_write(Idx2, Buf, ChunkExpAddress))
      idx2_ExitIf(true, "Write chunk exponent failed\n");
    Rewind(&E->ChunkExpStream);
    return;
  }
#endif

  /* brick exponents */
  Flush(&Sc->BrickExpStream);
  UncompressedExpChunksStat.Add((f64)Size(Sc->BrickExpStream));
  Rewind(&E->ChunkExpStream);
  CompressBufZstd(ToBuffer(Sc->BrickExpStream), &E->ChunkExpStream);
  CompressedExpChunksStat.Add((f64)Size(E->ChunkExpStream));

  /* rewind */
  Rewind(&Sc->BrickExpStream);

  /* write to file */
  file_id FileId = ConstructFilePath(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  /* keep track of the chunk sizes */
  auto CemIt = Lookup(E->ChunkExponents, FileId.Id);
  if (!CemIt)
  {
    chunk_exp_info ChunkExpInfo;
    InitWrite(&ChunkExpInfo.ExpSizes, 128);
    //Init(&ChunkEMaxInfo.FileEMaxBuffer, 128);
    Insert(&CemIt, FileId.Id, ChunkExpInfo);
  }
  chunk_exp_info* Ce = CemIt.Val;
  bitstream* ChunkEMaxSzs = &Ce->ExpSizes;
  GrowToAccomodate(ChunkEMaxSzs, 4);
  // write the size of the exponent stream for current chunk
  WriteVarByte(ChunkEMaxSzs, Size(E->ChunkExpStream));
  array<u8>* ExpBuffer = &Ce->FileExpBuffer;
  // write the exponents to the exponent buffer for the whole file
  PushBack(ExpBuffer, E->ChunkExpStream.Stream.Data, Size(E->ChunkExpStream));
  //printf("%lld %lld\n", Size(E->ChunkExpStream), Size(*EMaxBuffer));
  u64 ChunkExpAddress = GetChunkAddress(Idx2, Sc->LastBrick, Level, Subband, ExponentBitPlane_);
  PushBack(&Ce->Addrs, ChunkExpAddress);
  Rewind(&E->ChunkExpStream);
}